

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_set_vector_Test::ObjectTest_basic_set_vector_Test
          (ObjectTest_basic_set_vector_Test *this)

{
  ObjectTest_basic_set_vector_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ObjectTest_basic_set_vector_Test_0080fb68;
  return;
}

Assistant:

TEST(ObjectTest, basic_set_vector) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::vector<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<short>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<int>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<float>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<double>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::vector<object>);
}